

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O3

void * mempool_alloc(mempool *pool)

{
  size_t *psVar1;
  small_stats *psVar2;
  rlist *prVar3;
  mslab *node;
  void *pvVar4;
  rlist *prVar5;
  rlist *shift;
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  
  node = pool->first_hot_slab;
  if (node == (mslab *)0x0) {
    node = pool->spare;
    if (node == (mslab *)0x0) {
      node = (mslab *)slab_get_with_order(pool->cache,pool->slab_order);
      if (node == (mslab *)0x0) {
        prVar5 = (pool->cold_slabs).next;
        if ((prVar5 == &pool->cold_slabs) && (prVar5 == (pool->cold_slabs).prev)) {
          return (void *)0x0;
        }
        prVar3 = prVar5->next;
        (pool->cold_slabs).next = prVar3;
        prVar3->prev = &pool->cold_slabs;
        prVar5->prev = prVar5;
        prVar5->next = prVar5;
        node = (mslab *)(prVar5 + -5);
      }
      else {
        node->nfree = pool->objcount;
        node->free_offset = pool->offset;
        node->free_list = (void *)0x0;
        node->in_hot_slabs = false;
        node->mempool = pool;
        (node->next_in_cold).next = &node->next_in_cold;
        (node->next_in_cold).prev = &node->next_in_cold;
        prVar5 = &(node->slab).next_in_list;
        (node->slab).next_in_list.prev = &(pool->slabs).slabs;
        (node->slab).next_in_list.next = (pool->slabs).slabs.next;
        (pool->slabs).slabs.next = prVar5;
        ((node->slab).next_in_list.next)->prev = prVar5;
        psVar1 = &(pool->slabs).stats.total;
        *psVar1 = *psVar1 + (node->slab).size;
      }
    }
    else {
      pool->spare = (mslab *)0x0;
    }
    if (node->in_hot_slabs != false) {
      __assert_fail("slab->in_hot_slabs == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/mempool.c"
                    ,0xd1,"void *mempool_alloc(struct mempool *)");
    }
    mslab_tree_insert(&pool->hot_slabs,node);
    node->in_hot_slabs = true;
    pool->first_hot_slab = node;
  }
  psVar2 = &(pool->slabs).stats;
  psVar2->used = psVar2->used + (ulong)pool->objsize;
  pvVar4 = mslab_alloc(pool,node);
  if (pvVar4 != (void *)0x0) {
    return pvVar4;
  }
  __assert_fail("ptr != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/mempool.c"
                ,0xd8,"void *mempool_alloc(struct mempool *)");
}

Assistant:

void *
mempool_alloc(struct mempool *pool)
{
	struct mslab *slab = pool->first_hot_slab;
	if (slab == NULL) {
		if (pool->spare) {
			slab = pool->spare;
			pool->spare = NULL;

		} else if ((slab = (struct mslab *)
			    slab_get_with_order(pool->cache,
						pool->slab_order))) {
			mslab_create(slab, pool);
			slab_list_add(&pool->slabs, &slab->slab, next_in_list);
		} else if (! rlist_empty(&pool->cold_slabs)) {
			slab = rlist_shift_entry(&pool->cold_slabs, struct mslab,
						 next_in_cold);
		} else {
			return NULL;
		}
		assert(slab->in_hot_slabs == false);
		mslab_tree_insert(&pool->hot_slabs, slab);
		slab->in_hot_slabs = true;
		pool->first_hot_slab = slab;
	}
	pool->slabs.stats.used += pool->objsize;
	void *ptr = mslab_alloc(pool, slab);
	assert(ptr != NULL);
	VALGRIND_MALLOCLIKE_BLOCK(ptr, pool->objsize, 0, 0);
	return ptr;
}